

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_json_visitor<wchar_t>::visit_half
          (basic_json_visitor<wchar_t> *this,uint16_t value,semantic_tag tag,ser_context *context,
          error_code *ec)

{
  undefined7 in_register_00000011;
  
  binary::decode_half(value);
  (*this->_vptr_basic_json_visitor[0x12])
            (this,CONCAT71(in_register_00000011,tag) & 0xffffffff,context,ec);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_half(uint16_t value, 
            semantic_tag tag,
            const ser_context& context,
            std::error_code& ec)
        {
            visit_double(binary::decode_half(value),
                tag,
                context,
                ec);
            JSONCONS_VISITOR_RETURN;
        }